

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbSec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint nFrames;
  int iVar3;
  char *pcVar4;
  uint fVerbose;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  uint local_44;
  Abc_Ntk_t *local_40;
  Abc_Ntk_t *pNtk1;
  
  local_40 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nFrames = 2;
  bVar1 = true;
  while( true ) {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Fmvh"), iVar3 = globalUtilOptind, iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        if (bVar1) {
          if (globalUtilOptind + 1 == argc) {
            pcVar4 = "The miter cannot be given on the command line. Use \"read\".\n";
          }
          else {
            if (local_40->ntkType == ABC_NTK_STRASH) {
              iVar3 = Abc_NtkDarAbSec(local_40,(Abc_Ntk_t *)0x0,nFrames,fVerbose);
              if (iVar3 != 1) {
                pAbc->Status = -1;
                return 0;
              }
              pAbc->Status = 1;
              return 0;
            }
            pcVar4 = "The miter should be structurally hashed. Use \"st\"\n";
          }
        }
        else {
          iVar3 = Abc_NtkPrepareTwoNtks
                            (_stdout,local_40,argv + globalUtilOptind,argc - globalUtilOptind,&pNtk1
                             ,&pNtk2,&fDelete1,&fDelete2,1);
          if (iVar3 == 0) {
            return 1;
          }
          if ((pNtk1->nObjCounts[8] != 0) && (pNtk2->nObjCounts[8] != 0)) {
            iVar3 = Abc_NtkDarAbSec(pNtk1,pNtk2,nFrames,fVerbose);
            pAbc->Status = (uint)(iVar3 == 1) * 2 + -1;
            if (fDelete1 != 0) {
              Abc_NtkDelete(pNtk1);
            }
            if (fDelete2 != 0) {
              Abc_NtkDelete(pNtk2);
              return 0;
            }
            return 0;
          }
          if (fDelete1 != 0) {
            Abc_NtkDelete(pNtk1);
          }
          if (fDelete2 != 0) {
            Abc_NtkDelete(pNtk2);
          }
          pcVar4 = "The network has no latches. Used combinational command \"cec\".\n";
        }
        Abc_Print(-1,pcVar4);
        return 0;
      }
      if (iVar2 != 0x6d) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 != 0x46) goto LAB_0026cd7c;
    local_44 = nFrames;
    if (argc <= globalUtilOptind) break;
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nFrames < 0) {
LAB_0026cd7c:
      Abc_Print(-2,"usage: absec [-F num] [-mv] <file1> <file2>\n");
      Abc_Print(-2,"\t         performs SEC by applying CEC to several timeframes\n");
      Abc_Print(-2,"\t-F num : the total number of timeframes to use [default = %d]\n",
                (ulong)nFrames);
      pcVar4 = "miter";
      if (!bVar1) {
        pcVar4 = "two networks";
      }
      Abc_Print(-2,"\t-m     : toggles miter vs. two networks [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  nFrames = local_44;
  goto LAB_0026cd7c;
}

Assistant:

int Abc_CommandAbSec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int fMiter, nFrames, fVerbose, c;

    extern int Abc_NtkDarAbSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nFrames, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMiter   = 1;
    nFrames  = 2;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( fMiter )
    {
//        pNtk = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( argc == globalUtilOptind + 1 )
        {
            Abc_Print( -1, "The miter cannot be given on the command line. Use \"read\".\n" );
            return 0;
        }
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "The miter should be structurally hashed. Use \"st\"\n" );
            return 0;
        }
        if ( Abc_NtkDarAbSec( pNtk, NULL, nFrames, fVerbose ) == 1 )
            pAbc->Status = 1;
        else
            pAbc->Status = -1;
    }
    else
    {
        pArgvNew = argv + globalUtilOptind;
        nArgcNew = argc - globalUtilOptind;
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2, 1 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
            return 0;
        }
        // perform verification
        if ( Abc_NtkDarAbSec( pNtk1, pNtk2, nFrames, fVerbose ) == 1 )
            pAbc->Status = 1;
        else
            pAbc->Status = -1;
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: absec [-F num] [-mv] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs SEC by applying CEC to several timeframes\n" );
    Abc_Print( -2, "\t-F num : the total number of timeframes to use [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-m     : toggles miter vs. two networks [default = %s]\n", fMiter? "miter": "two networks" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}